

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O1

ze_result_t zesGetLedProcAddrTable(ze_api_version_t version,zes_led_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zes_pfnLedGetProperties_t p_Var3;
  zes_pfnLedGetState_t p_Var4;
  zes_pfnLedSetColor_t p_Var5;
  int iVar6;
  ze_result_t zVar7;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar8;
  bool bVar9;
  
  puVar8 = (undefined8 *)**(long **)(loader::context + 0x1610);
  puVar1 = (undefined8 *)(*(long **)(loader::context + 0x1610))[1];
  if (puVar1 != puVar8) {
    if (pDdiTable == (zes_led_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    bVar9 = false;
    for (; puVar8 != puVar1; puVar8 = puVar8 + 0x1b3) {
      if ((*(int *)(puVar8 + 1) == 0) &&
         (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar8,"zesGetLedProcAddrTable"),
         UNRECOVERED_JUMPTABLE != (code *)0x0)) {
        iVar6 = (*UNRECOVERED_JUMPTABLE)(version,puVar8 + 0x192);
        if (iVar6 == 0) {
          bVar9 = true;
        }
        else {
          *(int *)(puVar8 + 1) = iVar6;
        }
      }
    }
    if (!bVar9) {
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    lVar2 = **(long **)(loader::context + 0x1610);
    if (((ulong)(((*(long **)(loader::context + 0x1610))[1] - lVar2 >> 3) * 0x7aff6957aff6957b) < 2)
       && (*(char *)(loader::context + 0x1629) != '\x01')) {
      p_Var3 = *(zes_pfnLedGetProperties_t *)(lVar2 + 0xc90);
      p_Var4 = *(zes_pfnLedGetState_t *)(lVar2 + 0xc98);
      p_Var5 = *(zes_pfnLedSetColor_t *)(lVar2 + 0xca8);
      pDdiTable->pfnSetState = *(zes_pfnLedSetState_t *)(lVar2 + 0xca0);
      pDdiTable->pfnSetColor = p_Var5;
      pDdiTable->pfnGetProperties = p_Var3;
      pDdiTable->pfnGetState = p_Var4;
    }
    else {
      pDdiTable->pfnGetProperties = loader::zesLedGetProperties;
      pDdiTable->pfnGetState = loader::zesLedGetState;
      pDdiTable->pfnSetState = loader::zesLedSetState;
      pDdiTable->pfnSetColor = loader::zesLedSetColor;
    }
    if (*(long *)(loader::context + 0x1618) == 0) {
      return ZE_RESULT_SUCCESS;
    }
    UNRECOVERED_JUMPTABLE =
         (code *)dlsym(*(long *)(loader::context + 0x1618),"zesGetLedProcAddrTable");
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      zVar7 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
      return zVar7;
    }
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zesGetLedProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zes_led_dditable_t* pDdiTable                   ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->sysmanInstanceDrivers->size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : *loader::context->sysmanInstanceDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zes_pfnGetLedProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zesGetLedProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.zes.Led);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->sysmanInstanceDrivers->size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnGetProperties                            = loader::zesLedGetProperties;
            pDdiTable->pfnGetState                                 = loader::zesLedGetState;
            pDdiTable->pfnSetState                                 = loader::zesLedSetState;
            pDdiTable->pfnSetColor                                 = loader::zesLedSetColor;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->sysmanInstanceDrivers->front().dditable.zes.Led;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zes_pfnGetLedProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zesGetLedProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}